

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
tld::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
vector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *that)

{
  size_t sVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  this->DEFAULT_CAPACITY = 0x10;
  uVar5 = that->capacity_;
  uVar4 = uVar5 << 5;
  puVar2 = (ulong *)operator_new__(-(ulong)(uVar5 >> 0x3b != 0) | uVar4 | 8);
  *puVar2 = uVar5;
  if (uVar5 != 0) {
    puVar3 = puVar2 + 3;
    do {
      puVar3[-2] = (ulong)puVar3;
      puVar3[-1] = 0;
      *(undefined1 *)puVar3 = 0;
      puVar3 = puVar3 + 4;
      uVar4 = uVar4 - 0x20;
    } while (uVar4 != 0);
  }
  this->m_data_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar2 + 1);
  sVar1 = that->size_;
  this->size_ = sVar1;
  this->capacity_ = uVar5;
  if (sVar1 != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      std::__cxx11::string::_M_assign((string *)((long)&(this->m_data_->_M_dataplus)._M_p + lVar6));
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < this->size_);
  }
  return;
}

Assistant:

vector<T>::vector(const vector<T>& that) :
    m_data_(new T[that.capacity_]),
    size_(that.size_),
    capacity_(that.capacity_)
{
    for (std::size_t i = 0; i < size_; i++)
        m_data_[i] = that.m_data_[i];
}